

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int newton_min_trust(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double fsval,double delta,int method,int MAXITER,int *niter,double eps,
                    double gtol,double stol,double *xf)

{
  bool bVar1;
  int iVar2;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L_00;
  double *ioval_00;
  double eps2_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double *ioval;
  double *step;
  double *L;
  double *xc;
  double *scheck;
  double *hess;
  double *jac;
  double fxf;
  double maxstep;
  double stop0;
  double den;
  double num;
  double fx;
  double eps3;
  double eps2;
  double dt2;
  double dt1;
  int fdiff;
  int retval;
  int siter;
  int i;
  int hdcode;
  int gfdcode;
  int iter;
  int rcode;
  double stol_local;
  double gtol_local;
  double eps_local;
  double dStack_50;
  int method_local;
  double delta_local;
  double fsval_local;
  double *dx_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  f = (double *)malloc((long)N << 3);
  array = (double *)malloc((long)N << 3);
  xi_00 = (double *)malloc((long)N << 3);
  x = (double *)malloc((long)N << 3);
  H = (double *)malloc((long)N * 8 * (long)N);
  L_00 = (double *)malloc((long)N * 8 * (long)N);
  ioval_00 = (double *)malloc(0x40);
  gfdcode = 0;
  *niter = 0;
  pow(eps,0.3333333333333333);
  eps2_00 = sqrt(eps);
  dStack_50 = delta;
  if (delta <= 0.0) {
    dStack_50 = -1.0;
  }
  *ioval_00 = dStack_50;
  for (retval = 0; retval < N; retval = retval + 1) {
    xi[retval] = dx[retval] * xi[retval];
    dx[retval] = 1.0 / dx[retval];
  }
  dVar3 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    gfdcode = 0xf;
  }
  if (NAN(dVar3)) {
    printf("Program Exiting as the function returns NaN");
    gfdcode = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2_00,f);
  if (iVar2 == 0xf) {
    gfdcode = 0xf;
  }
  eps2 = 0.0;
  dt2 = 0.0;
  for (retval = 0; retval < N; retval = retval + 1) {
    dt2 = dx[retval] * dx[retval] + dt2;
    eps2 = dx[retval] * xi[retval] * dx[retval] * xi[retval] + eps2;
  }
  dVar4 = sqrt(dt2);
  dVar5 = sqrt(eps2);
  if (dVar5 < dVar4) {
    dVar5 = dVar4;
  }
  fxf = dVar5 * 1000.0;
  if (ABS(dVar3) <= ABS(fsval)) {
    stop0 = ABS(fsval);
  }
  else {
    stop0 = ABS(dVar3);
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    if (ABS(xi[retval]) <= 1.0 / ABS(dx[retval])) {
      den = 1.0 / ABS(dx[retval]);
    }
    else {
      den = ABS(xi[retval]);
    }
    array[retval] = (ABS(f[retval]) * den) / stop0;
  }
  dVar3 = array_max_abs(array,N);
  if (dVar3 <= gtol * 0.001) {
    gfdcode = 1;
    for (retval = 0; retval < N; retval = retval + 1) {
      xf[retval] = xi[retval];
    }
  }
  iVar2 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2_00,H);
  if (iVar2 == 0xf) {
    gfdcode = 0xf;
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    xi_00[retval] = xi[retval];
  }
  while( true ) {
    bVar1 = false;
    if (gfdcode == 0) {
      bVar1 = *niter < MAXITER;
    }
    if (!bVar1) goto LAB_00145dff;
    *niter = *niter + 1;
    modelhess(H,N,dx,eps,L_00);
    scale(f,1,N,-1.0);
    linsolve_lower(L_00,N,f,x);
    scale(f,1,N,-1.0);
    if (method == 0) {
      dt1._4_4_ = trsrch(funcpt,xi_00,f,x,N,dx,fxf,*niter,L_00,H,stol,ioval_00,eps,xf);
    }
    else {
      if (method != 1) {
        printf("The program accepts only two method values \n");
        printf("Method 0 : Hook step \n");
        printf("Method 1 : Double Dog Leg Step \n");
        exit(1);
      }
      dt1._4_4_ = trsrch_ddl(funcpt,xi_00,f,x,N,dx,fxf,*niter,L_00,H,stol,ioval_00,xf);
    }
    dVar3 = (*funcpt->funcpt)(xf,N,funcpt->params);
    if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
      printf("Program Exiting as the function value exceeds the maximum double value");
      gfdcode = 0xf;
      goto LAB_00145dff;
    }
    if (NAN(dVar3)) {
      printf("Program Exiting as the function returns NaN");
      gfdcode = 0xf;
      goto LAB_00145dff;
    }
    iVar2 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2_00,f);
    if (iVar2 == 0xf) break;
    gfdcode = stopcheck(dVar3,N,xi_00,xf,f,dx,fsval,gtol,stol,dt1._4_4_);
    iVar2 = hessian_opt(funcpt,funcgrad,xf,N,f,dx,eps,eps2_00,H);
    if (iVar2 == 0xf) {
      gfdcode = 0xf;
    }
    for (retval = 0; retval < N; retval = retval + 1) {
      xi_00[retval] = xf[retval];
    }
  }
  gfdcode = 0xf;
LAB_00145dff:
  if ((gfdcode == 0) && (MAXITER <= *niter)) {
    gfdcode = 4;
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    xi[retval] = dx[retval] * xi[retval];
    dx[retval] = 1.0 / dx[retval];
  }
  free(ioval_00);
  free(f);
  free(H);
  free(array);
  free(xi_00);
  free(L_00);
  free(x);
  return gfdcode;
}

Assistant:

int newton_min_trust(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double delta,
		int method,int MAXITER,int *niter,double eps,double gtol,double stol,double *xf) {
	int rcode,iter,gfdcode,hdcode;
	int i,siter,retval,fdiff;
	double dt1,dt2,eps2,eps3;
	double fx,num,den,stop0,maxstep,fxf;
	double *jac,*hess,*scheck,*xc,*L,*step;
	double *ioval;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	ioval = (double*) malloc(sizeof(double) *8);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps3 = pow(eps,(double) 1.0/3.0);
	eps2 = sqrt(eps);
	gfdcode = 0;
	hdcode = 0;
	//set values
	
	if (delta <= 0.0) {
		delta = -1.0;
	}
	ioval[0] = delta;
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	fdiff = 1;
	//grad_cd(funcpt,funcgrad,xi,N,dx,eps3,jac);
	
	maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx
	dt1 = dt2 = 0.0;
	for(i = 0; i < N;++i) {
		dt1 += dx[i] * dx[i];
		dt2 += dx[i] * xi[i] * dx[i] * xi[i];
	}

	dt1 = sqrt(dt1);
	dt2 = sqrt(dt2);
	
	if (dt1 > dt2) {
		maxstep *= dt1;
	} else {
		maxstep *= dt2;
	}
	

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		
	}
	
	//hessian_fd(funcpt,xi,N,dx,eps,hess);
	hdcode = hessian_opt(funcpt,funcgrad,xi,N,jac,dx,eps,eps2,hess);
	if (hdcode == 15) {
		rcode = 15;
	}
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		iter = *niter;
		if (method == 0) {
			retval = trsrch(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,eps,xf);
		} else if (method == 1) {
			retval = trsrch_ddl(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,xf);
		}
		else {
			printf("The program accepts only two method values \n");
			printf("Method 0 : Hook step \n");
			printf("Method 1 : Double Dog Leg Step \n");
			exit(1);
		}
		
		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jac);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		//grad_cd(funcpt,funcgrad,xf,N,dx,eps3,jac);
		rcode = stopcheck(fxf,N,xc,xf,jac,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,eps,hess);
		hdcode = hessian_opt(funcpt,funcgrad,xf,N,jac,dx,eps,eps2,hess);
		if (hdcode == 15) {
			rcode = 15;
		}
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(ioval);
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	return rcode;
}